

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionEvaluationFile.cxx
# Opt level: O3

void __thiscall
cmGeneratorExpressionEvaluationFile::Generate
          (cmGeneratorExpressionEvaluationFile *this,cmLocalGenerator *lg)

{
  pointer pcVar1;
  bool bVar2;
  ostream *poVar3;
  string *psVar4;
  string *psVar5;
  string *config;
  string *lang;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  enabledLanguages;
  mode_t perm;
  cmGeneratorExpression contentGE;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  allConfigs;
  auto_ptr<cmCompiledGeneratorExpression> inputExpression;
  string inputContent;
  cmListFileBacktrace lfbt;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  outputFiles;
  undefined1 local_478 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_458;
  string local_448;
  undefined1 local_428 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_408;
  cmGeneratorExpressionEvaluationFile *local_3f8;
  undefined1 *local_3f0;
  undefined8 local_3e8;
  undefined1 local_3e0;
  undefined7 uStack_3df;
  string local_3d0;
  undefined1 local_3b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a0 [6];
  ios_base local_340 [264];
  undefined1 local_238 [16];
  cmCompiledGeneratorExpression local_228;
  
  local_458._12_4_ = 0;
  local_3f0 = &local_3e0;
  local_3e8 = 0;
  local_3e0 = 0;
  local_458._M_allocated_capacity = (size_type)lg;
  if (this->InputIsContent == true) {
    std::__cxx11::string::_M_assign((string *)&local_3f0);
  }
  else {
    local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
    pcVar1 = (this->Input)._M_dataplus._M_p;
    local_3f8 = this;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_448,pcVar1,pcVar1 + (this->Input)._M_string_length);
    bVar2 = cmsys::SystemTools::FileIsFullPath(&local_448);
    if (bVar2) {
      cmsys::SystemTools::CollapseFullPath((string *)local_238,&local_448);
    }
    else {
      FixRelativePath((string *)local_238,local_3f8,&local_448,PathForInput,
                      (cmLocalGenerator *)local_458._M_allocated_capacity);
    }
    std::__cxx11::string::operator=((string *)&local_448,(string *)local_238);
    if ((cmCompiledGeneratorExpression *)local_238._0_8_ != &local_228) {
      operator_delete((void *)local_238._0_8_,(long)local_228.Backtrace.Bottom.State + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&(*(cmMakefile **)(local_458._M_allocated_capacity + 0x28))->ListFiles,&local_448);
    cmsys::SystemTools::GetPermissions
              (local_448._M_dataplus._M_p,(mode_t *)(local_458._M_local_buf + 0xc));
    std::ifstream::ifstream(local_238,local_448._M_dataplus._M_p,_S_in);
    local_408._12_4_ =
         *(uint *)((long)&local_228.Backtrace.Bottom.Position.Position +
                  (long)*(_Base_ptr *)(local_238._0_8_ + -0x18));
    if ((local_408._12_4_ & 5) == 0) {
      local_3b0._0_8_ = local_3a0;
      local_3b0._8_8_ = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)0x0;
      local_3a0[0]._M_local_buf[0] = '\0';
      local_478._0_8_ = local_478 + 0x10;
      local_478._8_8_ = (string *)0x0;
      local_478._16_8_ = local_478._16_8_ & 0xffffffffffffff00;
      while (bVar2 = cmsys::SystemTools::GetLineFromStream
                               ((istream *)local_238,(string *)local_3b0,(bool *)0x0,-1), bVar2) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_428,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_478,(string *)local_3b0);
        std::__cxx11::string::_M_append((char *)&local_3f0,local_428._0_8_);
        if ((string *)local_428._0_8_ != (string *)(local_428 + 0x10)) {
          operator_delete((void *)local_428._0_8_,local_428._16_8_ + 1);
        }
        std::__cxx11::string::_M_replace((ulong)local_478,0,(char *)local_478._8_8_,0x591fd9);
      }
      std::__cxx11::string::_M_append((char *)&local_3f0,local_478._0_8_);
      if ((string *)local_478._0_8_ != (string *)(local_478 + 0x10)) {
        operator_delete((void *)local_478._0_8_,local_478._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b0._0_8_ != local_3a0) {
        operator_delete((void *)local_3b0._0_8_,
                        CONCAT71(local_3a0[0]._M_allocated_capacity._1_7_,
                                 local_3a0[0]._M_local_buf[0]) + 1);
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_3b0,"Evaluation file \"",0x11);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_3b0,local_448._M_dataplus._M_p,local_448._M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\" cannot be read.",0x11);
      std::__cxx11::stringbuf::str();
      cmLocalGenerator::IssueMessage
                ((cmLocalGenerator *)local_458._M_allocated_capacity,FATAL_ERROR,(string *)local_478
                );
      if ((string *)local_478._0_8_ != (string *)(local_478 + 0x10)) {
        operator_delete((void *)local_478._0_8_,local_478._16_8_ + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b0);
      std::ios_base::~ios_base(local_340);
    }
    std::ifstream::~ifstream(local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_448._M_dataplus._M_p != &local_448.field_2) {
      operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
    }
    this = local_3f8;
    if ((local_408._12_4_ & 5) != 0) goto LAB_003e7e14;
  }
  cmListFileBacktrace::cmListFileBacktrace
            ((cmListFileBacktrace *)local_3b0,&((this->OutputFileExpr).x_)->Backtrace);
  cmGeneratorExpression::cmGeneratorExpression
            ((cmGeneratorExpression *)&local_448,(cmListFileBacktrace *)local_3b0);
  cmGeneratorExpression::Parse((cmGeneratorExpression *)local_238,&local_448);
  local_408._M_allocated_capacity = local_238._0_8_;
  local_238._0_8_ = (cmCompiledGeneratorExpression *)0x0;
  cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)local_238);
  local_228.Backtrace.Bottom.Position.Tree =
       (cmLinkedTree<cmStateDetail::SnapshotDataType> *)(local_238 + 8);
  local_238._8_4_ = _S_red;
  local_228.Backtrace.Bottom.State = (cmState *)0x0;
  local_228.Backtrace.Cur = (Entry *)0x0;
  local_428._16_8_ = 0;
  local_428._0_8_ = (string *)0x0;
  local_428._8_8_ = (string *)0x0;
  local_228.Backtrace.Bottom.Position.Position =
       (PositionType)local_228.Backtrace.Bottom.Position.Tree;
  cmMakefile::GetConfigurations
            (&local_3d0,*(cmMakefile **)(local_458._M_allocated_capacity + 0x28),
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_428,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
    operator_delete(local_3d0._M_dataplus._M_p,local_3d0.field_2._M_allocated_capacity + 1);
  }
  if (local_428._0_8_ == local_428._8_8_) {
    local_478._0_8_ = local_478 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_428,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_478);
    if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
      operator_delete((void *)local_478._0_8_,local_478._16_8_ + 1);
    }
  }
  local_478._0_8_ = (string *)0x0;
  local_478._8_8_ = (string *)0x0;
  local_478._16_8_ = 0;
  cmGlobalGenerator::GetEnabledLanguages
            (*(cmGlobalGenerator **)(local_458._M_allocated_capacity + 0x68),
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_478);
  if (local_478._0_8_ != local_478._8_8_) {
    psVar4 = (string *)local_478._8_8_;
    psVar5 = (string *)local_428._8_8_;
    lang = (string *)local_478._0_8_;
    do {
      config = (string *)local_428._0_8_;
      if ((string *)local_428._0_8_ != psVar5) {
        do {
          Generate(this,(cmLocalGenerator *)local_458._M_allocated_capacity,config,lang,
                   (cmCompiledGeneratorExpression *)local_408._M_allocated_capacity,
                   (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_238,local_458._12_4_);
          if ((cmSystemTools::s_FatalErrorOccured != false) ||
             (bVar2 = cmSystemTools::GetInterruptFlag(), bVar2)) goto LAB_003e7dcf;
          psVar5 = config + 1;
          psVar4 = (string *)local_478._8_8_;
          config = psVar5;
        } while (psVar5 != (string *)local_428._8_8_);
      }
      lang = lang + 1;
    } while (lang != psVar4);
  }
LAB_003e7dcf:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_478);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_428);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_238);
  cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)&local_408._M_allocated_capacity);
  cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)&local_448);
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_3b0);
LAB_003e7e14:
  if (local_3f0 != &local_3e0) {
    operator_delete(local_3f0,CONCAT71(uStack_3df,local_3e0) + 1);
  }
  return;
}

Assistant:

void cmGeneratorExpressionEvaluationFile::Generate(cmLocalGenerator* lg)
{
  mode_t perm = 0;
  std::string inputContent;
  if (this->InputIsContent) {
    inputContent = this->Input;
  } else {
    std::string inputFileName = this->Input;
    if (cmSystemTools::FileIsFullPath(inputFileName)) {
      inputFileName = cmSystemTools::CollapseFullPath(inputFileName);
    } else {
      inputFileName = this->FixRelativePath(inputFileName, PathForInput, lg);
    }
    lg->GetMakefile()->AddCMakeDependFile(inputFileName);
    cmSystemTools::GetPermissions(inputFileName.c_str(), perm);
    cmsys::ifstream fin(inputFileName.c_str());
    if (!fin) {
      std::ostringstream e;
      e << "Evaluation file \"" << inputFileName << "\" cannot be read.";
      lg->IssueMessage(cmake::FATAL_ERROR, e.str());
      return;
    }

    std::string line;
    std::string sep;
    while (cmSystemTools::GetLineFromStream(fin, line)) {
      inputContent += sep + line;
      sep = "\n";
    }
    inputContent += sep;
  }

  cmListFileBacktrace lfbt = this->OutputFileExpr->GetBacktrace();
  cmGeneratorExpression contentGE(lfbt);
  CM_AUTO_PTR<cmCompiledGeneratorExpression> inputExpression =
    contentGE.Parse(inputContent);

  std::map<std::string, std::string> outputFiles;

  std::vector<std::string> allConfigs;
  lg->GetMakefile()->GetConfigurations(allConfigs);

  if (allConfigs.empty()) {
    allConfigs.push_back("");
  }

  std::vector<std::string> enabledLanguages;
  cmGlobalGenerator* gg = lg->GetGlobalGenerator();
  gg->GetEnabledLanguages(enabledLanguages);

  for (std::vector<std::string>::const_iterator le = enabledLanguages.begin();
       le != enabledLanguages.end(); ++le) {
    for (std::vector<std::string>::const_iterator li = allConfigs.begin();
         li != allConfigs.end(); ++li) {
      this->Generate(lg, *li, *le, inputExpression.get(), outputFiles, perm);
      if (cmSystemTools::GetFatalErrorOccured()) {
        return;
      }
    }
  }
}